

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::BuildWCSMeshes
          (PretransformVertices *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *out,aiMesh **in,
          uint numIn,aiNode *node)

{
  aiMatrix4x4 *paVar1;
  float *pfVar2;
  aiMesh *src;
  aiBone **ppaVar3;
  iterator __position;
  PretransformVertices *this_00;
  int iVar4;
  pointer ppaVar5;
  Logger *this_01;
  pointer ppaVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  aiMesh *ntz;
  aiMesh *local_50;
  PretransformVertices *local_48;
  ulong local_40;
  aiMesh **local_38;
  
  uVar11 = (ulong)numIn;
  local_48 = this;
  if (node->mNumMeshes != 0) {
    paVar1 = &node->mTransformation;
    iVar4 = numIn - 1;
    uVar10 = 0;
    local_40 = uVar11;
    local_38 = in;
    do {
      uVar7 = node->mMeshes[uVar10];
      src = local_38[uVar7];
      ppaVar3 = src->mBones;
      if ((ppaVar3 == (aiBone **)0x0) ||
         (((((((((*(float *)ppaVar3 == paVar1->a1 && (!NAN(*(float *)ppaVar3) && !NAN(paVar1->a1)))
                && (pfVar2 = &(node->mTransformation).a2, *(float *)((long)ppaVar3 + 4) == *pfVar2))
               && ((!NAN(*(float *)((long)ppaVar3 + 4)) && !NAN(*pfVar2) &&
                   (pfVar2 = &(node->mTransformation).a3, *(float *)(ppaVar3 + 1) == *pfVar2)))) &&
              ((!NAN(*(float *)(ppaVar3 + 1)) && !NAN(*pfVar2) &&
               ((pfVar2 = &(node->mTransformation).a4, *(float *)((long)ppaVar3 + 0xc) == *pfVar2 &&
                (!NAN(*(float *)((long)ppaVar3 + 0xc)) && !NAN(*pfVar2))))))) &&
             ((pfVar2 = &(node->mTransformation).b1, *(float *)(ppaVar3 + 2) == *pfVar2 &&
              ((((!NAN(*(float *)(ppaVar3 + 2)) && !NAN(*pfVar2) &&
                 (pfVar2 = &(node->mTransformation).b2, *(float *)((long)ppaVar3 + 0x14) == *pfVar2)
                 ) && (!NAN(*(float *)((long)ppaVar3 + 0x14)) && !NAN(*pfVar2))) &&
               (((pfVar2 = &(node->mTransformation).b3, *(float *)(ppaVar3 + 3) == *pfVar2 &&
                 (!NAN(*(float *)(ppaVar3 + 3)) && !NAN(*pfVar2))) &&
                ((pfVar2 = &(node->mTransformation).b4, *(float *)((long)ppaVar3 + 0x1c) == *pfVar2
                 && ((!NAN(*(float *)((long)ppaVar3 + 0x1c)) && !NAN(*pfVar2) &&
                     (pfVar2 = &(node->mTransformation).c1, *(float *)(ppaVar3 + 4) == *pfVar2))))))
               )))))) && (!NAN(*(float *)(ppaVar3 + 4)) && !NAN(*pfVar2))) &&
           (((pfVar2 = &(node->mTransformation).c2, *(float *)((long)ppaVar3 + 0x24) == *pfVar2 &&
             (!NAN(*(float *)((long)ppaVar3 + 0x24)) && !NAN(*pfVar2))) &&
            (pfVar2 = &(node->mTransformation).c3, *(float *)(ppaVar3 + 5) == *pfVar2)))) &&
          (((!NAN(*(float *)(ppaVar3 + 5)) && !NAN(*pfVar2) &&
            (pfVar2 = &(node->mTransformation).c4, *(float *)((long)ppaVar3 + 0x2c) == *pfVar2)) &&
           ((((!NAN(*(float *)((long)ppaVar3 + 0x2c)) && !NAN(*pfVar2) &&
              ((pfVar2 = &(node->mTransformation).d1, *(float *)(ppaVar3 + 6) == *pfVar2 &&
               (!NAN(*(float *)(ppaVar3 + 6)) && !NAN(*pfVar2))))) &&
             (pfVar2 = &(node->mTransformation).d2, *(float *)((long)ppaVar3 + 0x34) == *pfVar2)) &&
            ((((!NAN(*(float *)((long)ppaVar3 + 0x34)) && !NAN(*pfVar2) &&
               (pfVar2 = &(node->mTransformation).d3, *(float *)(ppaVar3 + 7) == *pfVar2)) &&
              (!NAN(*(float *)(ppaVar3 + 7)) && !NAN(*pfVar2))) &&
             ((pfVar2 = &(node->mTransformation).d4, *(float *)((long)ppaVar3 + 0x3c) == *pfVar2 &&
              (!NAN(*(float *)((long)ppaVar3 + 0x3c)) && !NAN(*pfVar2))))))))))))) {
        src->mBones = (aiBone **)paVar1;
        src->mNumBones = 0xffffffff;
      }
      else {
        ppaVar5 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppaVar6 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppaVar6 != ppaVar5) {
          uVar7 = 1;
          uVar8 = uVar11 & 0xffffffff;
          uVar9 = 0;
          do {
            if (ppaVar5[uVar9]->mNumBones == node->mMeshes[uVar10]) {
              ppaVar3 = ppaVar5[uVar9]->mBones;
              if (((((*(float *)ppaVar3 == paVar1->a1) &&
                    (!NAN(*(float *)ppaVar3) && !NAN(paVar1->a1))) &&
                   ((pfVar2 = &(node->mTransformation).a2, *(float *)((long)ppaVar3 + 4) == *pfVar2
                    && (((!NAN(*(float *)((long)ppaVar3 + 4)) && !NAN(*pfVar2) &&
                         (pfVar2 = &(node->mTransformation).a3, *(float *)(ppaVar3 + 1) == *pfVar2))
                        && (!NAN(*(float *)(ppaVar3 + 1)) && !NAN(*pfVar2))))))) &&
                  (((pfVar2 = &(node->mTransformation).a4,
                    *(float *)((long)ppaVar3 + 0xc) == *pfVar2 &&
                    (!NAN(*(float *)((long)ppaVar3 + 0xc)) && !NAN(*pfVar2))) &&
                   (((pfVar2 = &(node->mTransformation).b1, *(float *)(ppaVar3 + 2) == *pfVar2 &&
                     (((!NAN(*(float *)(ppaVar3 + 2)) && !NAN(*pfVar2) &&
                       (pfVar2 = &(node->mTransformation).b2,
                       *(float *)((long)ppaVar3 + 0x14) == *pfVar2)) &&
                      ((!NAN(*(float *)((long)ppaVar3 + 0x14)) && !NAN(*pfVar2) &&
                       (((pfVar2 = &(node->mTransformation).b3, *(float *)(ppaVar3 + 3) == *pfVar2
                         && (!NAN(*(float *)(ppaVar3 + 3)) && !NAN(*pfVar2))) &&
                        (pfVar2 = &(node->mTransformation).b4,
                        *(float *)((long)ppaVar3 + 0x1c) == *pfVar2)))))))) &&
                    (((!NAN(*(float *)((long)ppaVar3 + 0x1c)) && !NAN(*pfVar2) &&
                      (pfVar2 = &(node->mTransformation).c1, *(float *)(ppaVar3 + 4) == *pfVar2)) &&
                     (!NAN(*(float *)(ppaVar3 + 4)) && !NAN(*pfVar2))))))))) &&
                 (((((pfVar2 = &(node->mTransformation).c2,
                     *(float *)((long)ppaVar3 + 0x24) == *pfVar2 &&
                     (!NAN(*(float *)((long)ppaVar3 + 0x24)) && !NAN(*pfVar2))) &&
                    ((pfVar2 = &(node->mTransformation).c3, *(float *)(ppaVar3 + 5) == *pfVar2 &&
                     (((((!NAN(*(float *)(ppaVar3 + 5)) && !NAN(*pfVar2) &&
                         (pfVar2 = &(node->mTransformation).c4,
                         *(float *)((long)ppaVar3 + 0x2c) == *pfVar2)) &&
                        (!NAN(*(float *)((long)ppaVar3 + 0x2c)) && !NAN(*pfVar2))) &&
                       ((pfVar2 = &(node->mTransformation).d1, *(float *)(ppaVar3 + 6) == *pfVar2 &&
                        (!NAN(*(float *)(ppaVar3 + 6)) && !NAN(*pfVar2))))) &&
                      (pfVar2 = &(node->mTransformation).d2,
                      *(float *)((long)ppaVar3 + 0x34) == *pfVar2)))))) &&
                   ((!NAN(*(float *)((long)ppaVar3 + 0x34)) && !NAN(*pfVar2) &&
                    (pfVar2 = &(node->mTransformation).d3, *(float *)(ppaVar3 + 7) == *pfVar2)))) &&
                  ((!NAN(*(float *)(ppaVar3 + 7)) && !NAN(*pfVar2) &&
                   ((pfVar2 = &(node->mTransformation).d4,
                    *(float *)((long)ppaVar3 + 0x3c) == *pfVar2 &&
                    (!NAN(*(float *)((long)ppaVar3 + 0x3c)) && !NAN(*pfVar2))))))))) {
                node->mMeshes[uVar10] = (uint)uVar8;
                ppaVar5 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                ppaVar6 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              }
            }
            uVar9 = (ulong)uVar7;
            uVar8 = (ulong)((uint)uVar8 + 1);
            uVar7 = uVar7 + 1;
          } while (uVar9 < (ulong)((long)ppaVar6 - (long)ppaVar5 >> 3));
          uVar7 = node->mMeshes[uVar10];
        }
        if (uVar7 < (uint)uVar11) {
          this_01 = DefaultLogger::get();
          Logger::info(this_01,"PretransformVertices: Copying mesh due to mismatching transforms");
          uVar7 = src->mNumBones;
          src->mNumBones = 0;
          SceneCombiner::Copy(&local_50,src);
          src->mNumBones = uVar7;
          local_50->mNumBones = node->mMeshes[uVar10];
          local_50->mBones = (aiBone **)paVar1;
          __position._M_current =
               (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)out,__position,&local_50);
            ppaVar5 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            *__position._M_current = local_50;
            ppaVar5 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 1;
            (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish = ppaVar5;
          }
          node->mMeshes[uVar10] =
               (int)((ulong)((long)ppaVar5 -
                            (long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) + iVar4;
          uVar11 = local_40;
        }
      }
      numIn = (uint)uVar11;
      uVar10 = uVar10 + 1;
      in = local_38;
    } while (uVar10 < node->mNumMeshes);
  }
  this_00 = local_48;
  if (node->mNumChildren != 0) {
    uVar11 = 0;
    do {
      BuildWCSMeshes(this_00,out,in,numIn,node->mChildren[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar11 < node->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::BuildWCSMeshes(std::vector<aiMesh*>& out, aiMesh** in,
    unsigned int numIn, aiNode* node)
{
    // NOTE:
    //  aiMesh::mNumBones store original source mesh, or UINT_MAX if not a copy
    //  aiMesh::mBones store reference to abs. transform we multiplied with

    // process meshes
    for (unsigned int i = 0; i < node->mNumMeshes;++i) {
        aiMesh* mesh = in[node->mMeshes[i]];

        // check whether we can operate on this mesh
        if (!mesh->mBones || *reinterpret_cast<aiMatrix4x4*>(mesh->mBones) == node->mTransformation) {
            // yes, we can.
            mesh->mBones = reinterpret_cast<aiBone**> (&node->mTransformation);
            mesh->mNumBones = UINT_MAX;
        }
        else {

            // try to find us in the list of newly created meshes
            for (unsigned int n = 0; n < out.size(); ++n) {
                aiMesh* ctz = out[n];
                if (ctz->mNumBones == node->mMeshes[i] && *reinterpret_cast<aiMatrix4x4*>(ctz->mBones) ==  node->mTransformation) {

                    // ok, use this one. Update node mesh index
                    node->mMeshes[i] = numIn + n;
                }
            }
            if (node->mMeshes[i] < numIn) {
                // Worst case. Need to operate on a full copy of the mesh
                ASSIMP_LOG_INFO("PretransformVertices: Copying mesh due to mismatching transforms");
                aiMesh* ntz;

                const unsigned int tmp = mesh->mNumBones; //
                mesh->mNumBones = 0;
                SceneCombiner::Copy(&ntz,mesh);
                mesh->mNumBones = tmp;

                ntz->mNumBones = node->mMeshes[i];
                ntz->mBones = reinterpret_cast<aiBone**> (&node->mTransformation);

                out.push_back(ntz);

                node->mMeshes[i] = static_cast<unsigned int>(numIn + out.size() - 1);
            }
        }
    }

    // call children
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        BuildWCSMeshes(out,in,numIn,node->mChildren[i]);
}